

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O1

string * flatbuffers::anon_unknown_7::ToValueString<unsigned_long>
                   (string *__return_storage_ptr__,BinaryRegion *region,uint8_t *binary)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  char cVar5;
  byte *pbVar6;
  ulong uVar7;
  string __str;
  string local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  ulong local_38;
  
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_38 = *(ulong *)(binary + region->offset);
  if (region->length != 0) {
    pbVar6 = binary + region->offset + region->length;
    uVar7 = 0;
    uVar4 = extraout_RDX;
    do {
      pbVar6 = pbVar6 + -1;
      ToHex_abi_cxx11_(&local_60,(flatbuffers *)(ulong)*pbVar6,(uint8_t)uVar4);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
      uVar4 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        uVar4 = extraout_RDX_01;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < region->length);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  uVar7 = local_38;
  cVar5 = '\x01';
  if (9 < local_38) {
    uVar3 = local_38;
    cVar2 = '\x04';
    do {
      cVar5 = cVar2;
      if (uVar3 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_003237e3;
      }
      if (uVar3 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_003237e3;
      }
      if (uVar3 < 10000) goto LAB_003237e3;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      cVar2 = cVar5 + '\x04';
    } while (bVar1);
    cVar5 = cVar5 + '\x01';
  }
LAB_003237e3:
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_60,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_60._M_dataplus._M_p,(uint)local_60._M_string_length,uVar7);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ToValueString(const BinaryRegion &region, const uint8_t *binary) {
  std::string s;
  s += "0x";
  const T val = ReadScalar<T>(binary + region.offset);
  const uint64_t start_index = region.offset + region.length - 1;
  for (uint64_t i = 0; i < region.length; ++i) {
    s += ToHex(binary[start_index - i]);
  }
  s += " (";
  s += ToString(val);
  s += ")";
  return s;
}